

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.c
# Opt level: O2

void av1_tokenize_sb_vartx
               (AV1_COMP *cpi,ThreadData_conflict *td,RUN_TYPE dry_run,BLOCK_SIZE bsize,int *rate,
               uint8_t allow_update_cdf)

{
  BLOCK_SIZE plane_bsize;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  uint num_planes;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint blk_row;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  byte bVar16;
  MACROBLOCK *x;
  uint uVar17;
  int block;
  ulong uVar18;
  int blk_col;
  uint blk_col_00;
  uint uVar19;
  uint uVar20;
  bool bVar21;
  tokenize_b_args arg;
  
  if (((td->mb).e_mbd.mi_row < (cpi->common).mi_params.mi_rows) &&
     ((td->mb).e_mbd.mi_col < (cpi->common).mi_params.mi_cols)) {
    bVar21 = ((cpi->common).seq_params)->monochrome == '\0';
    num_planes = bVar21 + 1 + (uint)bVar21;
    arg.this_rate = 0;
    arg.cpi = cpi;
    arg.td = td;
    arg.allow_update_cdf = allow_update_cdf;
    arg.dry_run = dry_run;
    if ((*(td->mb).e_mbd.mi)->skip_txfm == '\0') {
      uVar18 = 0;
      while ((uVar18 != num_planes && ((uVar18 == 0 || ((td->mb).e_mbd.is_chroma_ref == true))))) {
        lVar11 = (long)(td->mb).e_mbd.plane[uVar18].subsampling_x;
        lVar12 = (long)(td->mb).e_mbd.plane[uVar18].subsampling_y;
        plane_bsize = av1_ss_size_lookup[bsize][lVar11][lVar12];
        block = 0;
        uVar15 = 0;
        if ((td->mb).e_mbd.lossless[*(ushort *)&(*(td->mb).e_mbd.mi)->field_0xa7 & 7] == 0) {
          bVar1 = ""[plane_bsize];
          bVar16 = bVar1;
          if (((uVar18 != 0) && (bVar16 = 3, 1 < bVar1 - 0xb)) && (bVar1 != 4)) {
            if (bVar1 == 0x11) {
              bVar16 = 9;
            }
            else {
              bVar16 = bVar1;
              if (bVar1 == 0x12) {
                bVar16 = 10;
              }
            }
          }
          uVar15 = (ulong)bVar16;
        }
        bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                [plane_bsize];
        bVar16 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                 [plane_bsize];
        bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                [txsize_to_bsize[uVar15]];
        bVar3 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                [txsize_to_bsize[uVar15]];
        uVar14 = (ulong)(uint)((int)uVar15 << 2);
        iVar7 = *(int *)((long)tx_size_high_unit + uVar14);
        iVar8 = *(int *)((long)tx_size_wide_unit + uVar14);
        bVar4 = *(byte *)(lVar12 + lVar11 * 2 + 0x4735e0);
        bVar5 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bVar4];
        if (bVar1 < "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [bVar4]) {
          bVar5 = bVar1;
        }
        bVar6 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[bVar4];
        if (bVar16 < "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [bVar4]) {
          bVar6 = bVar16;
        }
        uVar9 = 0;
        while (uVar17 = uVar9, uVar20 = (uint)bVar16, uVar17 < uVar20) {
          uVar9 = bVar6 + uVar17;
          if (uVar9 < uVar20) {
            uVar20 = uVar9;
          }
          uVar10 = 0;
          while (uVar13 = uVar10, uVar19 = (uint)bVar1, uVar13 < uVar19) {
            uVar10 = bVar5 + uVar13;
            blk_row = uVar17;
            if (uVar10 < uVar19) {
              uVar19 = uVar10;
            }
            for (; blk_col_00 = uVar13, blk_row < uVar20; blk_row = blk_row + bVar3) {
              for (; blk_col_00 < uVar19; blk_col_00 = blk_col_00 + bVar2) {
                tokenize_vartx(td,(TX_SIZE)uVar15,plane_bsize,blk_row,blk_col_00,block,(int)uVar18,
                               &arg);
                block = block + iVar7 * iVar8;
              }
            }
          }
        }
        uVar18 = uVar18 + 1;
      }
      if (rate != (int *)0x0) {
        *rate = *rate + arg.this_rate;
      }
    }
    else {
      av1_reset_entropy_context(&(td->mb).e_mbd,bsize,num_planes);
    }
  }
  return;
}

Assistant:

void av1_tokenize_sb_vartx(const AV1_COMP *cpi, ThreadData *td,
                           RUN_TYPE dry_run, BLOCK_SIZE bsize, int *rate,
                           uint8_t allow_update_cdf) {
  assert(bsize < BLOCK_SIZES_ALL);
  const AV1_COMMON *const cm = &cpi->common;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  if (mi_row >= cm->mi_params.mi_rows || mi_col >= cm->mi_params.mi_cols)
    return;

  const int num_planes = av1_num_planes(cm);
  MB_MODE_INFO *const mbmi = xd->mi[0];
  struct tokenize_b_args arg = { cpi, td, 0, allow_update_cdf, dry_run };

  if (mbmi->skip_txfm) {
    av1_reset_entropy_context(xd, bsize, num_planes);
    return;
  }

  for (int plane = 0; plane < num_planes; ++plane) {
    if (plane && !xd->is_chroma_ref) break;
    const struct macroblockd_plane *const pd = &xd->plane[plane];
    const int ss_x = pd->subsampling_x;
    const int ss_y = pd->subsampling_y;
    const BLOCK_SIZE plane_bsize = get_plane_block_size(bsize, ss_x, ss_y);
    assert(plane_bsize < BLOCK_SIZES_ALL);
    const int mi_width = mi_size_wide[plane_bsize];
    const int mi_height = mi_size_high[plane_bsize];
    const TX_SIZE max_tx_size = get_vartx_max_txsize(xd, plane_bsize, plane);
    const BLOCK_SIZE txb_size = txsize_to_bsize[max_tx_size];
    const int bw = mi_size_wide[txb_size];
    const int bh = mi_size_high[txb_size];
    int block = 0;
    const int step =
        tx_size_wide_unit[max_tx_size] * tx_size_high_unit[max_tx_size];

    const BLOCK_SIZE max_unit_bsize =
        get_plane_block_size(BLOCK_64X64, ss_x, ss_y);
    int mu_blocks_wide = mi_size_wide[max_unit_bsize];
    int mu_blocks_high = mi_size_high[max_unit_bsize];

    mu_blocks_wide = AOMMIN(mi_width, mu_blocks_wide);
    mu_blocks_high = AOMMIN(mi_height, mu_blocks_high);

    for (int idy = 0; idy < mi_height; idy += mu_blocks_high) {
      for (int idx = 0; idx < mi_width; idx += mu_blocks_wide) {
        const int unit_height = AOMMIN(mu_blocks_high + idy, mi_height);
        const int unit_width = AOMMIN(mu_blocks_wide + idx, mi_width);
        for (int blk_row = idy; blk_row < unit_height; blk_row += bh) {
          for (int blk_col = idx; blk_col < unit_width; blk_col += bw) {
            tokenize_vartx(td, max_tx_size, plane_bsize, blk_row, blk_col,
                           block, plane, &arg);
            block += step;
          }
        }
      }
    }
  }
  if (rate) *rate += arg.this_rate;
}